

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
operator()(udl_formatter<char,____,__0_,__:_,__1_,__0_,____> *this,int *args)

{
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool invalid_format;
  char s [7];
  error_handler local_31;
  basic_string_view<char> local_30;
  undefined1 local_20;
  char local_1f [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str;
  
  builtin_strncpy(local_1f,"{0:10}",7);
  format_str = in_RDI;
  basic_string_view<char>::basic_string_view(&local_30,local_1f,6);
  error_handler::error_handler(&local_31);
  local_20 = do_check_format_string<char,fmt::v5::internal::error_handler,int>
                       (local_30.data_,local_30.size_,&local_31);
  format<char[7],int>((char (*) [7])format_str,in_RSI);
  return in_RDI;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }